

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86.cpp
# Opt level: O1

int __thiscall
ncnn::BatchNorm_x86::forward_inplace(BatchNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  float *pfVar22;
  int iVar23;
  
  iVar15 = bottom_top_blob->dims;
  if (bottom_top_blob->elempack == 4) {
    if (iVar15 == 2) {
      iVar16 = bottom_top_blob->h;
      if (0 < (long)iVar16) {
        iVar21 = bottom_top_blob->w;
        pp_Var6 = this->_vptr_BatchNorm_x86;
        lVar20 = 0;
        do {
          if (0 < iVar21) {
            pfVar22 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var6[-3]) + lVar20 * 0x10);
            fVar4 = *pfVar22;
            fVar5 = pfVar22[1];
            fVar8 = pfVar22[2];
            fVar9 = pfVar22[3];
            pfVar22 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var6[-3]) + lVar20 * 0x10);
            fVar10 = *pfVar22;
            fVar11 = pfVar22[1];
            fVar12 = pfVar22[2];
            fVar13 = pfVar22[3];
            pfVar22 = (float *)(bottom_top_blob->w * lVar20 * bottom_top_blob->elemsize +
                               (long)bottom_top_blob->data);
            iVar23 = iVar21;
            do {
              *pfVar22 = *pfVar22 * fVar10 + fVar4;
              pfVar22[1] = pfVar22[1] * fVar11 + fVar5;
              pfVar22[2] = pfVar22[2] * fVar12 + fVar8;
              pfVar22[3] = pfVar22[3] * fVar13 + fVar9;
              pfVar22 = pfVar22 + 4;
              iVar23 = iVar23 + -1;
            } while (iVar23 != 0);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 != iVar16);
      }
    }
    else if ((iVar15 == 1) && (iVar16 = bottom_top_blob->w, 0 < (long)iVar16)) {
      pp_Var6 = this->_vptr_BatchNorm_x86;
      lVar20 = 0;
      do {
        pfVar22 = (float *)((long)bottom_top_blob->data + lVar20);
        fVar4 = pfVar22[1];
        fVar5 = pfVar22[2];
        fVar8 = pfVar22[3];
        pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var6[-3]) + lVar20);
        fVar9 = pfVar1[1];
        fVar10 = pfVar1[2];
        fVar11 = pfVar1[3];
        pfVar2 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var6[-3]) + lVar20);
        fVar12 = pfVar2[1];
        fVar13 = pfVar2[2];
        fVar14 = pfVar2[3];
        pfVar3 = (float *)((long)bottom_top_blob->data + lVar20);
        *pfVar3 = *pfVar22 * *pfVar1 + *pfVar2;
        pfVar3[1] = fVar4 * fVar9 + fVar12;
        pfVar3[2] = fVar5 * fVar10 + fVar13;
        pfVar3[3] = fVar8 * fVar11 + fVar14;
        lVar20 = lVar20 + 0x10;
      } while ((long)iVar16 * 0x10 != lVar20);
    }
    if ((iVar15 - 3U < 2) && (iVar15 = bottom_top_blob->c, 0 < (long)iVar15)) {
      iVar16 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pp_Var6 = this->_vptr_BatchNorm_x86;
      lVar20 = 0;
      do {
        if (0 < iVar16) {
          pfVar22 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var6[-3]) + lVar20 * 0x10);
          fVar4 = *pfVar22;
          fVar5 = pfVar22[1];
          fVar8 = pfVar22[2];
          fVar9 = pfVar22[3];
          pfVar22 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var6[-3]) + lVar20 * 0x10);
          fVar10 = *pfVar22;
          fVar11 = pfVar22[1];
          fVar12 = pfVar22[2];
          fVar13 = pfVar22[3];
          pfVar22 = (float *)(bottom_top_blob->cstep * lVar20 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          iVar21 = iVar16;
          do {
            *pfVar22 = *pfVar22 * fVar10 + fVar4;
            pfVar22[1] = pfVar22[1] * fVar11 + fVar5;
            pfVar22[2] = pfVar22[2] * fVar12 + fVar8;
            pfVar22[3] = pfVar22[3] * fVar13 + fVar9;
            pfVar22 = pfVar22 + 4;
            iVar21 = iVar21 + -1;
          } while (iVar21 != 0);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != iVar15);
    }
  }
  else {
    if (iVar15 - 5U < 0xfffffffe) {
      iVar15 = BatchNorm::forward_inplace
                         ((BatchNorm *)
                          ((long)&this->_vptr_BatchNorm_x86 + (long)this->_vptr_BatchNorm_x86[-3]),
                          bottom_top_blob,opt);
      return iVar15;
    }
    pp_Var6 = this->_vptr_BatchNorm_x86;
    if (0 < *(int *)(&this->field_0xd0 + (long)pp_Var6[-3])) {
      uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pp_Var7 = this->_vptr_BatchNorm_x86;
      lVar20 = 0;
      do {
        pfVar22 = (float *)(bottom_top_blob->cstep * lVar20 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        fVar4 = *(float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var7[-3]) + lVar20 * 4);
        fVar5 = *(float *)(*(long *)(&this->field_0x240 + (long)pp_Var7[-3]) + lVar20 * 4);
        if ((int)uVar17 < 4) {
          uVar18 = 0;
        }
        else {
          iVar15 = 3;
          do {
            *pfVar22 = *pfVar22 * fVar5 + fVar4;
            pfVar22[1] = pfVar22[1] * fVar5 + fVar4;
            pfVar22[2] = pfVar22[2] * fVar5 + fVar4;
            pfVar22[3] = pfVar22[3] * fVar5 + fVar4;
            pfVar22 = pfVar22 + 4;
            iVar15 = iVar15 + 4;
            uVar18 = uVar17 & 0xfffffffc;
          } while (iVar15 < (int)uVar17);
        }
        if (uVar17 - uVar18 != 0 && (int)uVar18 <= (int)uVar17) {
          lVar19 = 0;
          do {
            pfVar22[lVar19] = pfVar22[lVar19] * fVar5 + fVar4;
            lVar19 = lVar19 + 1;
          } while (uVar17 - uVar18 != (int)lVar19);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < *(int *)(&this->field_0xd0 + (long)pp_Var6[-3]));
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    int elempack = bottom_top_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;

                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + q * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + q * 8);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;

                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                __m128 _p = _mm_load_ps(ptr);
                _p = _mm_mul_ps(_p, _b);
                _p = _mm_add_ps(_p, _a);
                _mm_store_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + q * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + q * 4);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3 && dims != 4)
        return BatchNorm::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    // int c = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float a = a_data[q];
        float b = b_data[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        __m256 _a256 = _mm256_set1_ps(a);
        __m256 _b256 = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_comp_fmadd_ps(_p, _b256, _a256);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
        __m128 _a128 = _mm256_castps256_ps128(_a256);
        __m128 _b128 = _mm256_castps256_ps128(_b256);
#else
        __m128 _a128 = _mm_set1_ps(a);
        __m128 _b128 = _mm_set1_ps(b);
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_mul_ps(_p, _b128);
            _p = _mm_add_ps(_p, _a128);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = b * *ptr + a;

            ptr++;
        }
    }

    return 0;
}